

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

int __thiscall DataVector::copy(DataVector *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  long local_8;
  
  local_8 = *(long *)(dst + 8) - *(long *)dst >> 4;
  iVar1 = copy(dst,(EVP_PKEY_CTX *)&local_8);
  return iVar1;
}

Assistant:

void
    copy(DataVector const & src, std::vector<bool> const & mask)
    {
        DataVector::copy(src, src.size(), *this, this->size(), mask, mask.size());
    }